

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS ref_cavity_surf_geom_edge_pass(REF_GRID_conflict ref_grid)

{
  REF_NODE pRVar1;
  REF_CELL ref_cell;
  REF_CELL ref_cell_00;
  REF_INT node;
  REF_STATUS RVar2;
  uint uVar3;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT local;
  REF_DBL xyz_phys [3];
  int local_d4;
  REF_STATUS ref_private_macro_code_rsb;
  REF_BOOL improved;
  REF_CAVITY ref_cavity;
  REF_DBL normdev;
  int local_b8;
  REF_INT tri_cell;
  REF_INT i;
  REF_INT edge_tri [2];
  REF_INT ncell;
  REF_INT nodes [27];
  REF_INT cell;
  REF_INT node1;
  REF_INT node0;
  REF_CELL edg;
  REF_CELL tri;
  REF_NODE ref_node;
  REF_GRID_conflict ref_grid_local;
  
  pRVar1 = ref_grid->node;
  ref_cell = ref_grid->cell[3];
  ref_cell_00 = ref_grid->cell[0];
  if (ref_grid->surf != 0) {
    for (nodes[0x19] = 0; nodes[0x19] < ref_cell_00->max; nodes[0x19] = nodes[0x19] + 1) {
      RVar2 = ref_cell_nodes(ref_cell_00,nodes[0x19],edge_tri + 1);
      node = edge_tri[1];
      if ((RVar2 == 0) && (pRVar1->ref_mpi->id == pRVar1->part[edge_tri[1]])) {
        uVar3 = ref_cell_list_with2(ref_cell,edge_tri[1],ncell,2,edge_tri,&tri_cell);
        if (uVar3 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0xac5,"ref_cavity_surf_geom_edge_pass",(ulong)uVar3,"tris");
          printf(" %.16e %.16e %.16e\n",ref_grid->node->real[node * 0xf],
                 ref_grid->node->real[node * 0xf + 1],ref_grid->node->real[node * 0xf + 2]);
          printf(" %.16e %.16e %.16e\n",ref_grid->node->real[ncell * 0xf],
                 ref_grid->node->real[ncell * 0xf + 1],ref_grid->node->real[ncell * 0xf + 2]);
          ref_export_tec_surf(ref_grid,"ref_cavity_geom_edge_fail.tec");
          return uVar3;
        }
        for (local_b8 = 0; local_b8 < edge_tri[0]; local_b8 = local_b8 + 1) {
          normdev._4_4_ = (&tri_cell)[local_b8];
          uVar3 = ref_cell_nodes(ref_cell,normdev._4_4_,edge_tri + 1);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xac8,"ref_cavity_surf_geom_edge_pass",(ulong)uVar3,"cell nodes");
            return uVar3;
          }
          uVar3 = ref_geom_tri_norm_deviation(ref_grid,edge_tri + 1,(REF_DBL *)&ref_cavity);
          if (uVar3 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0xac9,"ref_cavity_surf_geom_edge_pass",(ulong)uVar3,"nd");
            return uVar3;
          }
          if ((double)ref_cavity < 0.5) {
            uVar3 = ref_cavity_create((REF_CAVITY *)&ref_private_macro_code_rsb);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xacb,"ref_cavity_surf_geom_edge_pass",(ulong)uVar3,"create");
              return uVar3;
            }
            uVar3 = ref_cavity_form_empty(_ref_private_macro_code_rsb,ref_grid,node);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xacc,"ref_cavity_surf_geom_edge_pass",(ulong)uVar3,"insert ball");
              return uVar3;
            }
            uVar3 = ref_cavity_add_tri(_ref_private_macro_code_rsb,normdev._4_4_);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xacd,"ref_cavity_surf_geom_edge_pass",(ulong)uVar3,"insert tri");
              return uVar3;
            }
            uVar3 = ref_cavity_enlarge_conforming(_ref_private_macro_code_rsb);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xace,"ref_cavity_surf_geom_edge_pass",(ulong)uVar3,"enlarge tri");
              return uVar3;
            }
            if (_ref_private_macro_code_rsb->state == REF_CAVITY_VISIBLE) {
              uVar3 = ref_cavity_normdev(_ref_private_macro_code_rsb,&local_d4);
              if (uVar3 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0xad0,"ref_cavity_surf_geom_edge_pass",(ulong)uVar3,"normdev tri");
                return uVar3;
              }
              if ((local_d4 != 0) &&
                 (uVar3 = ref_cavity_replace(_ref_private_macro_code_rsb), uVar3 != 0)) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0xad2,"ref_cavity_surf_geom_edge_pass",(ulong)uVar3,"replace tri");
                return uVar3;
              }
            }
            uVar3 = ref_cavity_free(_ref_private_macro_code_rsb);
            if (uVar3 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0xad5,"ref_cavity_surf_geom_edge_pass",(ulong)uVar3,"free");
              return uVar3;
            }
          }
        }
      }
    }
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_surf_geom_edge_pass(REF_GRID ref_grid) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL tri = ref_grid_tri(ref_grid);
  REF_CELL edg = ref_grid_edg(ref_grid);
  REF_INT node0, node1, cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_INT ncell;
  REF_INT edge_tri[2];
  REF_INT i, tri_cell;
  REF_DBL normdev;
  REF_CAVITY ref_cavity;
  REF_BOOL improved;

  if (!ref_grid_surf(ref_grid)) return REF_SUCCESS;

  each_ref_cell_valid_cell_with_nodes(edg, cell, nodes) {
    node0 = nodes[0];
    node1 = nodes[1];

    /* expands around node0, should try node1 too? */

    /* skip unless node0 is owned */
    if (!ref_node_owned(ref_node, node0)) {
      continue;
    }

    RSB(ref_cell_list_with2(tri, node0, node1, 2, &ncell, edge_tri), "tris", {
      REF_DBL xyz_phys[3];
      REF_INT local;
      local = node0;
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      printf(" %.16e %.16e %.16e\n", xyz_phys[0], xyz_phys[1], xyz_phys[2]);
      local = node1;
      xyz_phys[0] = ref_node_xyz(ref_grid_node(ref_grid), 0, local);
      xyz_phys[1] = ref_node_xyz(ref_grid_node(ref_grid), 1, local);
      xyz_phys[2] = ref_node_xyz(ref_grid_node(ref_grid), 2, local);
      printf(" %.16e %.16e %.16e\n", xyz_phys[0], xyz_phys[1], xyz_phys[2]);
      ref_export_tec_surf(ref_grid, "ref_cavity_geom_edge_fail.tec");
    });
    for (i = 0; i < ncell; i++) {
      tri_cell = edge_tri[i];
      RSS(ref_cell_nodes(tri, tri_cell, nodes), "cell nodes");
      RSS(ref_geom_tri_norm_deviation(ref_grid, nodes, &normdev), "nd");
      if (normdev < 0.5) {
        RSS(ref_cavity_create(&ref_cavity), "create");
        RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node0), "insert ball");
        RSS(ref_cavity_add_tri(ref_cavity, tri_cell), "insert tri");
        RSS(ref_cavity_enlarge_conforming(ref_cavity), "enlarge tri");
        if (REF_CAVITY_VISIBLE == ref_cavity_state(ref_cavity)) {
          RSS(ref_cavity_normdev(ref_cavity, &improved), "normdev tri");
          if (improved) {
            RSS(ref_cavity_replace(ref_cavity), "replace tri");
          }
        }
        RSS(ref_cavity_free(ref_cavity), "free");
      }
    }
  }
  return REF_SUCCESS;
}